

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initDDict_internal
                 (ZSTD_DDict *ddict,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_customMem customMem;
  uint uVar1;
  void *__dest;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t err_code;
  void *internalBuffer;
  ZSTD_DDict *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  size_t local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  if (((in_ECX == 1) || (in_RSI == (void *)0x0)) || (in_RDX == 0)) {
    *in_RDI = 0;
    in_RDI[1] = in_RSI;
    if (in_RSI == (void *)0x0) {
      local_20 = 0;
    }
  }
  else {
    in_stack_ffffffffffffffa8 = (ZSTD_DDict *)in_RDI[0xd58];
    customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffc8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
    customMem.opaque = in_stack_ffffffffffffffd0;
    __dest = ZSTD_customMalloc((size_t)in_stack_ffffffffffffffa8,customMem);
    *in_RDI = __dest;
    in_RDI[1] = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,in_RSI,in_RDX);
  }
  in_RDI[2] = local_20;
  *(undefined4 *)(in_RDI + 0x506) = 0xc00000c;
  local_8 = ZSTD_loadEntropy_intoDDict(in_stack_ffffffffffffffa8,ZSTD_dct_auto);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_initDDict_internal(ZSTD_DDict* ddict,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType)
{
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dict) || (!dictSize)) {
        ddict->dictBuffer = NULL;
        ddict->dictContent = dict;
        if (!dict) dictSize = 0;
    } else {
        void* const internalBuffer = ZSTD_customMalloc(dictSize, ddict->cMem);
        ddict->dictBuffer = internalBuffer;
        ddict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        ZSTD_memcpy(internalBuffer, dict, dictSize);
    }
    ddict->dictSize = dictSize;
    ddict->entropy.hufTable[0] = (HUF_DTable)((ZSTD_HUFFDTABLE_CAPACITY_LOG)*0x1000001);  /* cover both little and big endian */

    /* parse dictionary content */
    FORWARD_IF_ERROR( ZSTD_loadEntropy_intoDDict(ddict, dictContentType) , "");

    return 0;
}